

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS
ref_gather_node_tec_block
          (REF_NODE ref_node,REF_GLOB nnode,REF_GLOB *l2c,REF_INT ldim,REF_DBL *scalar,
          int dataformat,FILE *file)

{
  REF_MPI ref_mpi;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  REF_INT *sorted_index;
  REF_GLOB *original;
  void *pvVar6;
  void *output;
  size_t sVar7;
  size_t sVar8;
  int iVar9;
  ulong uVar10;
  REF_DBL *pRVar11;
  undefined8 uVar12;
  REF_LONG ref_private_status_reis_bi;
  long lVar13;
  char *pcVar14;
  long lVar15;
  ulong uVar16;
  REF_STATUS ref_private_macro_code_rxs;
  REF_LONG ref_private_status_reis_ai_1;
  float single_float;
  REF_INT position;
  REF_LONG ref_private_status_reis_ai;
  uint local_b0;
  float local_60;
  int local_5c;
  ulong local_58;
  ulong local_50;
  long local_48;
  size_t local_40;
  REF_DBL *local_38;
  
  ref_mpi = ref_node->ref_mpi;
  iVar9 = ref_node->max;
  lVar13 = (long)iVar9;
  if (lVar13 < 1) {
    uVar1 = 0;
  }
  else {
    lVar15 = 0;
    uVar1 = 0;
    do {
      if (l2c[lVar15] != -1) {
        uVar1 = uVar1 + (ref_mpi->id == ref_node->part[lVar15]);
      }
      lVar15 = lVar15 + 1;
    } while (lVar13 != lVar15);
  }
  if ((int)uVar1 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xff,
           "ref_gather_node_tec_block","malloc sorted_local of REF_INT negative");
    return 1;
  }
  sVar7 = (ulong)uVar1 * 4;
  local_38 = scalar;
  sorted_index = (REF_INT *)malloc(sVar7);
  if (sorted_index == (REF_INT *)0x0) {
    pcVar14 = "malloc sorted_local of REF_INT NULL";
    uVar12 = 0xff;
  }
  else {
    original = (REF_GLOB *)malloc((ulong)uVar1 << 3);
    if (original == (REF_GLOB *)0x0) {
      pcVar14 = "malloc sorted_cellnode of REF_GLOB NULL";
      uVar12 = 0x100;
    }
    else {
      pvVar6 = malloc(sVar7);
      if (pvVar6 == (void *)0x0) {
        pcVar14 = "malloc pack of REF_INT NULL";
        uVar12 = 0x101;
      }
      else {
        if (iVar9 < 1) {
          uVar1 = 0;
        }
        else {
          lVar15 = 0;
          uVar1 = 0;
          do {
            if ((l2c[lVar15] != -1) && (ref_mpi->id == ref_node->part[lVar15])) {
              original[(int)uVar1] = l2c[lVar15];
              *(int *)((long)pvVar6 + (long)(int)uVar1 * 4) = (int)lVar15;
              uVar1 = uVar1 + 1;
            }
            lVar15 = lVar15 + 1;
          } while (lVar13 != lVar15);
        }
        uVar2 = ref_sort_heap_glob(uVar1,original,sorted_index);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x10c,"ref_gather_node_tec_block",(ulong)uVar2,"sort");
          return uVar2;
        }
        if (0 < (int)uVar1) {
          uVar10 = 0;
          do {
            iVar9 = *(int *)((long)pvVar6 + (long)sorted_index[uVar10] * 4);
            sorted_index[uVar10] = iVar9;
            original[uVar10] = l2c[iVar9];
            uVar10 = uVar10 + 1;
          } while (uVar1 != uVar10);
        }
        free(pvVar6);
        uVar3 = (int)(nnode / (long)ref_mpi->n) + 1;
        uVar2 = 100000;
        if (100000 < (int)uVar3) {
          uVar2 = uVar3;
        }
        uVar3 = 0x7fffffff;
        if (0 < ref_mpi->reduce_byte_limit) {
          uVar3 = (uint)ref_mpi->reduce_byte_limit >> 3;
        }
        if ((int)uVar3 <= (int)uVar2) {
          uVar2 = uVar3;
        }
        local_58 = (ulong)uVar2;
        sVar7 = local_58 * 8;
        pvVar6 = malloc(sVar7);
        if (pvVar6 == (void *)0x0) {
          pcVar14 = "malloc local_xyzm of REF_DBL NULL";
          uVar12 = 0x118;
        }
        else {
          output = malloc(sVar7);
          if (output != (void *)0x0) {
            if (-3 < ldim) {
              local_40 = (ulong)((int)local_58 - 1) * 8 + 8;
              iVar9 = ldim + 2;
              if (iVar9 < 1) {
                iVar9 = 0;
              }
              uVar10 = 0;
              local_b0 = 0;
              do {
                if (nnode < 1) {
                  lVar13 = 0;
                  uVar16 = uVar10;
                }
                else {
                  lVar13 = 0;
                  local_50 = uVar10;
                  do {
                    uVar16 = nnode - lVar13;
                    if ((long)local_58 <= nnode - lVar13) {
                      uVar16 = local_58;
                    }
                    if (uVar3 != 0) {
                      memset(pvVar6,0,local_40);
                    }
                    uVar2 = (uint)uVar16;
                    local_48 = lVar13;
                    if (0 < (int)uVar2) {
                      uVar16 = 0;
                      do {
                        uVar4 = ref_sort_search_glob(uVar1,original,local_48 + uVar16,&local_5c);
                        if ((uVar4 != 0) && (uVar4 != 5)) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                 ,0x129,"ref_gather_node_tec_block",(ulong)uVar4,"node local failed"
                                );
                          local_b0 = uVar4;
                        }
                        if (uVar4 != 5) {
                          if (uVar4 != 0) {
                            return local_b0;
                          }
                          if ((uint)local_50 < 3) {
                            iVar5 = sorted_index[local_5c] * 0xf + (uint)local_50;
                            pRVar11 = ref_node->real;
                          }
                          else {
                            iVar5 = sorted_index[local_5c] * ldim + (int)uVar10 + -3;
                            pRVar11 = local_38;
                          }
                          *(REF_DBL *)((long)pvVar6 + uVar16 * 8) = pRVar11[iVar5];
                        }
                        uVar16 = uVar16 + 1;
                      } while ((uVar2 & 0x7fffffff) != uVar16);
                    }
                    uVar4 = ref_mpi_sum(ref_mpi,pvVar6,output,uVar2,3);
                    if (uVar4 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0x134,"ref_gather_node_tec_block",(ulong)uVar4,"sum");
                      return uVar4;
                    }
                    sVar7 = (size_t)(int)uVar2;
                    if (ref_mpi->id == 0) {
                      if (dataformat == 2) {
                        sVar8 = fwrite(output,8,sVar7,(FILE *)file);
                        if (sVar7 != sVar8) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                 ,0x142,"ref_gather_node_tec_block","block chunk",sVar7,sVar8);
                          return 1;
                        }
                      }
                      else {
                        if (dataformat != 1) {
                          return 6;
                        }
                        if (0 < (int)uVar2) {
                          uVar16 = 0;
                          do {
                            local_60 = (float)*(double *)((long)output + uVar16 * 8);
                            sVar8 = fwrite(&local_60,4,1,(FILE *)file);
                            if (sVar8 != 1) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                     ,0x13d,"ref_gather_node_tec_block","single float",1,sVar8);
                              return 1;
                            }
                            uVar16 = uVar16 + 1;
                          } while ((uVar2 & 0x7fffffff) != uVar16);
                        }
                      }
                    }
                    lVar13 = local_48 + sVar7;
                    uVar16 = local_50;
                  } while (lVar13 < nnode);
                }
                if (lVar13 != nnode) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x149,"ref_gather_node_tec_block","node miscount",nnode,lVar13);
                  return 1;
                }
                uVar10 = (ulong)((int)uVar16 + 1);
              } while ((int)uVar16 != iVar9);
            }
            free(output);
            free(pvVar6);
            free(original);
            free(sorted_index);
            return 0;
          }
          pcVar14 = "malloc xyzm of REF_DBL NULL";
          uVar12 = 0x119;
        }
      }
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar12,
         "ref_gather_node_tec_block",pcVar14);
  return 2;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node_tec_block(
    REF_NODE ref_node, REF_GLOB nnode, REF_GLOB *l2c, REF_INT ldim,
    REF_DBL *scalar, int dataformat, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_GLOB nnode_written, first, global;
  REF_INT local, n, i, ivar;
  REF_STATUS status;
  REF_INT *sorted_local, *pack, total_cellnode, position;
  REF_GLOB *sorted_cellnode;

  total_cellnode = 0;
  for (i = 0; i < ref_node_max(ref_node); i++) {
    if (REF_EMPTY != l2c[i] && ref_node_owned(ref_node, i)) {
      total_cellnode++;
    }
  }

  ref_malloc(sorted_local, total_cellnode, REF_INT);
  ref_malloc(sorted_cellnode, total_cellnode, REF_GLOB);
  ref_malloc(pack, total_cellnode, REF_INT);

  total_cellnode = 0;
  for (i = 0; i < ref_node_max(ref_node); i++) {
    if (REF_EMPTY != l2c[i] && ref_node_owned(ref_node, i)) {
      sorted_cellnode[total_cellnode] = l2c[i];
      pack[total_cellnode] = i;
      total_cellnode++;
    }
  }
  RSS(ref_sort_heap_glob(total_cellnode, sorted_cellnode, sorted_local),
      "sort");
  for (i = 0; i < total_cellnode; i++) {
    sorted_local[i] = pack[sorted_local[i]];
    sorted_cellnode[i] = l2c[sorted_local[i]];
  }
  ref_free(pack);

  chunk = (REF_INT)(nnode / ref_mpi_n(ref_mpi) + 1);
  chunk = MAX(chunk, 100000);
  chunk =
      MIN(chunk, ref_mpi_reduce_chunk_limit(ref_mpi, (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, chunk, REF_DBL);
  ref_malloc(xyzm, chunk, REF_DBL);

  for (ivar = 0; ivar < 3 + ldim; ivar++) {
    nnode_written = 0;
    while (nnode_written < nnode) {
      first = nnode_written;
      n = (REF_INT)MIN((REF_GLOB)chunk, nnode - nnode_written);

      nnode_written += n;

      for (i = 0; i < chunk; i++) local_xyzm[i] = 0.0;

      for (i = 0; i < n; i++) {
        global = first + i;
        status = ref_sort_search_glob(total_cellnode, sorted_cellnode, global,
                                      &position);
        RXS(status, REF_NOT_FOUND, "node local failed");
        if (REF_SUCCESS == status) {
          local = sorted_local[position];
          if (ivar < 3) {
            local_xyzm[i] = ref_node_xyz(ref_node, ivar, local);
          } else {
            local_xyzm[i] = scalar[(ivar - 3) + ldim * local];
          }
        }
      }

      RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, n, REF_DBL_TYPE), "sum");

      if (ref_mpi_once(ref_mpi)) {
        switch (dataformat) {
          case 1:
            for (i = 0; i < n; i++) {
              float single_float;
              single_float = (float)xyzm[i];
              REIS(1, fwrite(&single_float, sizeof(float), 1, file),
                   "single float");
            }
            break;
          case 2:
            REIS(n, fwrite(xyzm, sizeof(double), (unsigned long)n, file),
                 "block chunk");
            break;
          default:
            return REF_IMPLEMENT;
        }
      }
    }
    REIS(nnode, nnode_written, "node miscount");
  }

  ref_free(xyzm);
  ref_free(local_xyzm);
  ref_free(sorted_cellnode);
  ref_free(sorted_local);

  return REF_SUCCESS;
}